

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

HasHasbitTestParam * __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<google::protobuf::descriptor_unittest::HasHasbitTestParam>::Iterator
::Current(Iterator *this)

{
  HasHasbitTestParam *pHVar1;
  pointer pcVar2;
  _Head_base<0UL,_const_google::protobuf::descriptor_unittest::HasHasbitTestParam_*,_false> __ptr;
  _Head_base<0UL,_const_google::protobuf::descriptor_unittest::HasHasbitTestParam_*,_false> _Var3;
  unique_ptr<const_google::protobuf::descriptor_unittest::HasHasbitTestParam,_std::default_delete<const_google::protobuf::descriptor_unittest::HasHasbitTestParam>_>
  *this_00;
  
  _Var3._M_head_impl =
       (this->value_)._M_t.
       super___uniq_ptr_impl<const_google::protobuf::descriptor_unittest::HasHasbitTestParam,_std::default_delete<const_google::protobuf::descriptor_unittest::HasHasbitTestParam>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_google::protobuf::descriptor_unittest::HasHasbitTestParam_*,_std::default_delete<const_google::protobuf::descriptor_unittest::HasHasbitTestParam>_>
       .
       super__Head_base<0UL,_const_google::protobuf::descriptor_unittest::HasHasbitTestParam_*,_false>
       ._M_head_impl;
  if (_Var3._M_head_impl == (HasHasbitTestParam *)0x0) {
    _Var3._M_head_impl = (HasHasbitTestParam *)operator_new(0x28);
    pHVar1 = (this->iterator_)._M_current;
    *(string **)&(_Var3._M_head_impl)->input_foo_proto =
         (string *)((long)&(_Var3._M_head_impl)->input_foo_proto + 0x10);
    pcVar2 = (pHVar1->input_foo_proto)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)_Var3._M_head_impl,pcVar2,
               pcVar2 + (pHVar1->input_foo_proto)._M_string_length);
    this_00 = &this->value_;
    *(undefined4 *)&(_Var3._M_head_impl)->expected_output = *(undefined4 *)&pHVar1->expected_output;
    __ptr._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<const_google::protobuf::descriptor_unittest::HasHasbitTestParam,_std::default_delete<const_google::protobuf::descriptor_unittest::HasHasbitTestParam>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_google::protobuf::descriptor_unittest::HasHasbitTestParam_*,_std::default_delete<const_google::protobuf::descriptor_unittest::HasHasbitTestParam>_>
         .
         super__Head_base<0UL,_const_google::protobuf::descriptor_unittest::HasHasbitTestParam_*,_false>
         ._M_head_impl;
    (this_00->_M_t).
    super___uniq_ptr_impl<const_google::protobuf::descriptor_unittest::HasHasbitTestParam,_std::default_delete<const_google::protobuf::descriptor_unittest::HasHasbitTestParam>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::descriptor_unittest::HasHasbitTestParam_*,_std::default_delete<const_google::protobuf::descriptor_unittest::HasHasbitTestParam>_>
    .super__Head_base<0UL,_const_google::protobuf::descriptor_unittest::HasHasbitTestParam_*,_false>
    ._M_head_impl = _Var3._M_head_impl;
    if (__ptr._M_head_impl != (HasHasbitTestParam *)0x0) {
      std::default_delete<const_google::protobuf::descriptor_unittest::HasHasbitTestParam>::
      operator()((default_delete<const_google::protobuf::descriptor_unittest::HasHasbitTestParam> *)
                 this_00,__ptr._M_head_impl);
      _Var3._M_head_impl =
           (this_00->_M_t).
           super___uniq_ptr_impl<const_google::protobuf::descriptor_unittest::HasHasbitTestParam,_std::default_delete<const_google::protobuf::descriptor_unittest::HasHasbitTestParam>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_google::protobuf::descriptor_unittest::HasHasbitTestParam_*,_std::default_delete<const_google::protobuf::descriptor_unittest::HasHasbitTestParam>_>
           .
           super__Head_base<0UL,_const_google::protobuf::descriptor_unittest::HasHasbitTestParam_*,_false>
           ._M_head_impl;
    }
  }
  return _Var3._M_head_impl;
}

Assistant:

virtual ~ParamGeneratorInterface() = default;